

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O0

void CB_EXPLORE::print_update_cb_explore(vw *all,bool is_test,example *ec,stringstream *pred_string)

{
  cb_class *pcVar1;
  long in_RDX;
  byte in_SIL;
  long *in_RDI;
  double dVar2;
  stringstream label_string;
  string local_1f8 [32];
  string local_1d8 [48];
  stringstream local_1a8 [16];
  undefined1 local_198 [40];
  float in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  size_t in_stack_fffffffffffffe98;
  string *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  size_t in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffebf;
  shared_data *in_stack_fffffffffffffec0;
  
  dVar2 = shared_data::weighted_examples((shared_data *)*in_RDI);
  if ((((double)*(float *)(*in_RDI + 0x50) <= dVar2) &&
      ((*(byte *)((long)in_RDI + 0x3439) & 1) == 0)) && ((*(byte *)((long)in_RDI + 0x9c) & 1) == 0))
  {
    std::__cxx11::stringstream::stringstream(local_1a8);
    if ((in_SIL & 1) == 0) {
      pcVar1 = v_array<CB::cb_class>::operator[]((v_array<CB::cb_class> *)(in_RDX + 0x6828),0);
      std::ostream::operator<<(local_198,pcVar1->action);
    }
    else {
      std::operator<<((ostream *)local_198," unknown");
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::str();
    shared_data::print_update
              (in_stack_fffffffffffffec0,(bool)in_stack_fffffffffffffebf,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (bool)in_stack_fffffffffffffe97,in_stack_fffffffffffffe90);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return;
}

Assistant:

void print_update_cb_explore(vw& all, bool is_test, example& ec, stringstream& pred_string)
{
  if (all.sd->weighted_examples() >= all.sd->dump_interval && !all.quiet && !all.bfgs)
  {
    stringstream label_string;
    if (is_test)
      label_string << " unknown";
    else
      label_string << ec.l.cb.costs[0].action;
    all.sd->print_update(all.holdout_set_off, all.current_pass, label_string.str(), pred_string.str(), ec.num_features,
        all.progress_add, all.progress_arg);
  }
}